

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

int evmap_io_check_integrity_fn(event_base *base,int fd,evmap_io *io_info,void *arg)

{
  ushort uVar1;
  uint extraout_EAX;
  uint uVar2;
  event *peVar3;
  event *peVar4;
  evmap_io *extraout_RDX;
  uint uVar5;
  event *peVar6;
  uint uVar7;
  event *peVar8;
  evmap_io *peVar9;
  
  peVar3 = (io_info->events).lh_first;
  uVar5 = 0;
  uVar2 = 0;
  peVar6 = peVar3;
  peVar8 = peVar3;
  if (peVar3 == (event *)0x0) {
    uVar7 = 0;
    uVar5 = 0;
  }
  else {
    do {
      peVar9 = io_info;
      uVar2 = uVar5;
      peVar4 = peVar3;
      if ((peVar6 == (event *)0x0) ||
         (peVar8 = (peVar8->ev_).ev_io.ev_io_next.le_next, peVar8 == (event *)0x0))
      goto LAB_001dd5b1;
      if (peVar6 == peVar8) goto LAB_001dd660;
      peVar8 = (peVar8->ev_).ev_io.ev_io_next.le_next;
      if (peVar8 == (event *)0x0) goto LAB_001dd5b1;
      peVar6 = (peVar6->ev_).ev_io.ev_io_next.le_next;
    } while (peVar6 != peVar8);
    evmap_io_check_integrity_fn_cold_1();
    peVar9 = extraout_RDX;
    uVar2 = extraout_EAX;
    io_info = extraout_RDX;
    peVar4 = peVar3;
LAB_001dd5b1:
    do {
      if (peVar9 != (evmap_io *)(peVar3->ev_).ev_io.ev_io_next.le_prev) {
        evmap_io_check_integrity_fn_cold_2();
        goto LAB_001dd64c;
      }
      peVar8 = (peVar3->ev_).ev_io.ev_io_next.le_next;
      peVar9 = (evmap_io *)&peVar3->ev_;
      peVar3 = peVar8;
    } while (peVar8 != (event *)0x0);
    uVar7 = 0;
    uVar5 = 0;
    if (peVar4 != (event *)0x0) {
      uVar5 = 0;
      uVar7 = 0;
      uVar2 = 0;
      do {
        if (((peVar4->ev_evcallback).evcb_flags & 2) == 0) goto LAB_001dd64c;
        if (peVar4->ev_fd != fd) goto LAB_001dd651;
        uVar1 = peVar4->ev_events;
        if ((uVar1 & 8) != 0) goto LAB_001dd656;
        if ((uVar1 & 0x86) == 0) goto LAB_001dd65b;
        uVar2 = uVar2 + ((uVar1 >> 1 & 1) != 0);
        uVar7 = uVar7 + ((uVar1 >> 2 & 1) != 0);
        uVar5 = uVar5 + ((uVar1 >> 7 & 1) != 0);
        peVar4 = (peVar4->ev_).ev_io.ev_io_next.le_next;
      } while (peVar4 != (event *)0x0);
    }
  }
  if (uVar2 != io_info->nread) goto LAB_001dd665;
  if (uVar7 == io_info->nwrite) {
    if (uVar5 == io_info->nclose) {
      return 0;
    }
    goto LAB_001dd66f;
  }
LAB_001dd66a:
  evmap_io_check_integrity_fn_cold_9();
LAB_001dd66f:
  evmap_io_check_integrity_fn_cold_10();
LAB_001dd64c:
  evmap_io_check_integrity_fn_cold_6();
LAB_001dd651:
  evmap_io_check_integrity_fn_cold_3();
LAB_001dd656:
  evmap_io_check_integrity_fn_cold_4();
LAB_001dd65b:
  evmap_io_check_integrity_fn_cold_5();
LAB_001dd660:
  evmap_io_check_integrity_fn_cold_7();
LAB_001dd665:
  evmap_io_check_integrity_fn_cold_8();
  goto LAB_001dd66a;
}

Assistant:

static int
evmap_io_check_integrity_fn(struct event_base *base, evutil_socket_t fd,
    struct evmap_io *io_info, void *arg)
{
	struct event *ev;
	int n_read = 0, n_write = 0, n_close = 0;

	/* First, make sure the list itself isn't corrupt. Otherwise,
	 * running LIST_FOREACH could be an exciting adventure. */
	EVUTIL_ASSERT_LIST_OK(&io_info->events, event, ev_io_next);

	LIST_FOREACH(ev, &io_info->events, ev_io_next) {
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_INSERTED);
		EVUTIL_ASSERT(ev->ev_fd == fd);
		EVUTIL_ASSERT(!(ev->ev_events & EV_SIGNAL));
		EVUTIL_ASSERT((ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED)));
		if (ev->ev_events & EV_READ)
			++n_read;
		if (ev->ev_events & EV_WRITE)
			++n_write;
		if (ev->ev_events & EV_CLOSED)
			++n_close;
	}

	EVUTIL_ASSERT(n_read == io_info->nread);
	EVUTIL_ASSERT(n_write == io_info->nwrite);
	EVUTIL_ASSERT(n_close == io_info->nclose);

	return 0;
}